

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O2

REF_STATUS ref_export_eps(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_DBL *pRVar3;
  REF_STATUS RVar4;
  uint uVar5;
  FILE *__s;
  int iVar6;
  long lVar7;
  REF_INT nodes [27];
  
  pRVar1 = ref_grid->node;
  __s = fopen("ref_export.gnuplot","w");
  if (__s == (FILE *)0x0) {
    puts("unable to open ref_export.gnuplot");
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x6c7,
           "ref_export_eps","unable to open file");
    uVar5 = 2;
  }
  else {
    fwrite("reset\n",6,1,__s);
    fwrite("set term postscript eps\n",0x18,1,__s);
    fprintf(__s,"set output \'%s\'\n",filename);
    fwrite("set size ratio -1\n",0x12,1,__s);
    fwrite("set xlabel \'X\'\n",0xf,1,__s);
    fwrite("set ylabel \'Z\'\n",0xf,1,__s);
    fwrite("plot \'-\' title \'\' with lines lw 0.5\n",0x24,1,__s);
    pRVar2 = ref_grid->cell[3];
    for (iVar6 = 0; iVar6 < pRVar2->max; iVar6 = iVar6 + 1) {
      RVar4 = ref_cell_nodes(pRVar2,iVar6,nodes);
      if (RVar4 == 0) {
        for (lVar7 = 0; pRVar3 = pRVar1->real, lVar7 < pRVar2->node_per; lVar7 = lVar7 + 1) {
          fprintf(__s,"%25.15f %25.15f\n",pRVar3[(long)nodes[lVar7] * 0xf],
                  pRVar3[(long)nodes[lVar7] * 0xf + 2]);
        }
        fprintf(__s,"%25.15f %25.15f\n",pRVar3[(long)nodes[0] * 0xf],
                pRVar3[(long)nodes[0] * 0xf + 2]);
        fwrite("\n\n",2,1,__s);
      }
    }
    pRVar2 = ref_grid->cell[6];
    for (iVar6 = 0; iVar6 < pRVar2->max; iVar6 = iVar6 + 1) {
      RVar4 = ref_cell_nodes(pRVar2,iVar6,nodes);
      if (RVar4 == 0) {
        for (lVar7 = 0; pRVar3 = pRVar1->real, lVar7 < pRVar2->node_per; lVar7 = lVar7 + 1) {
          fprintf(__s,"%25.15f %25.15f\n",pRVar3[(long)nodes[lVar7] * 0xf],
                  pRVar3[(long)nodes[lVar7] * 0xf + 2]);
        }
        fprintf(__s,"%25.15f %25.15f\n",pRVar3[(long)nodes[0] * 0xf],
                pRVar3[(long)nodes[0] * 0xf + 2]);
        fwrite("\n\n",2,1,__s);
      }
    }
    fwrite("e\n",2,1,__s);
    fclose(__s);
    iVar6 = system("gnuplot ref_export.gnuplot");
    if (iVar6 == 0) {
      iVar6 = remove("ref_export.gnuplot");
      if (iVar6 != 0) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x6ed,"ref_export_eps","temp clean up",0,(long)iVar6);
      }
      uVar5 = (uint)(iVar6 != 0);
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x6ec,"ref_export_eps","gnuplot failed",0,(long)iVar6);
      uVar5 = 1;
    }
  }
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_export_eps(REF_GRID ref_grid,
                                         const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT node, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  f = fopen("ref_export.gnuplot", "w");
  if (NULL == (void *)f) printf("unable to open ref_export.gnuplot\n");
  RNS(f, "unable to open file");

  fprintf(f, "reset\n");
  fprintf(f, "set term postscript eps\n");
  fprintf(f, "set output '%s'\n", filename);
  fprintf(f, "set size ratio -1\n");
  fprintf(f, "set xlabel 'X'\n");
  fprintf(f, "set ylabel 'Z'\n");
  fprintf(f, "plot '-' title '' with lines lw 0.5\n");

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      fprintf(f, "%25.15f %25.15f\n", ref_node_xyz(ref_node, 0, nodes[node]),
              ref_node_xyz(ref_node, 2, nodes[node]));
    }
    node = 0;
    fprintf(f, "%25.15f %25.15f\n", ref_node_xyz(ref_node, 0, nodes[node]),
            ref_node_xyz(ref_node, 2, nodes[node]));
    fprintf(f, "\n\n");
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      fprintf(f, "%25.15f %25.15f\n", ref_node_xyz(ref_node, 0, nodes[node]),
              ref_node_xyz(ref_node, 2, nodes[node]));
    }
    node = 0;
    fprintf(f, "%25.15f %25.15f\n", ref_node_xyz(ref_node, 0, nodes[node]),
            ref_node_xyz(ref_node, 2, nodes[node]));
    fprintf(f, "\n\n");
  }

  fprintf(f, "e\n");
  fclose(f);

  REIS(0, system("gnuplot ref_export.gnuplot"), "gnuplot failed");
  REIS(0, remove("ref_export.gnuplot"), "temp clean up");

  return REF_SUCCESS;
}